

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O0

void brngBlockInc(octet *block)

{
  long lVar1;
  size_t sVar2;
  bool local_19;
  word *w;
  size_t i;
  octet *block_local;
  
  i = 0;
  do {
    sVar2 = i;
    *(long *)(block + i * 8) = *(long *)(block + i * 8) + 1;
    lVar1 = i * 8;
    if (*(long *)(block + lVar1) == 0) {
      i = i + 1;
    }
    local_19 = *(long *)(block + lVar1) == 0 && sVar2 < 4;
  } while (local_19);
  return;
}

Assistant:

static void brngBlockInc(octet block[32])
{
	register size_t i = 0;
	word* w = (word*)block;
	do
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		w[i] = wordRev(w[i]);
		++w[i];
		w[i] = wordRev(w[i]);
#else
		++w[i];
#endif
	}
	while (w[i] == 0 && i++ < W_OF_O(32));
	i = 0;
}